

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O0

void __thiscall
Js::DynamicObject::ResetObject(DynamicObject *this,DynamicType *newType,BOOL keepProperties)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 *puVar5;
  DynamicTypeHandler *pDVar6;
  ScriptContext *pSVar7;
  ScriptContext *pSVar8;
  undefined8 local_60;
  Var typeTransitionMap;
  Var embedderData;
  Var mutationBpValue;
  Var weakMapKeyMapValue;
  Var stackTraceValue;
  DynamicTypeHandler *local_30;
  DynamicTypeHandler *oldTypeHandler;
  DynamicType *oldType;
  DynamicType *pDStack_18;
  BOOL keepProperties_local;
  DynamicType *newType_local;
  DynamicObject *this_local;
  
  oldType._4_4_ = keepProperties;
  pDStack_18 = newType;
  newType_local = (DynamicType *)this;
  if (newType == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                ,0x2dd,"(newType != __null)","newType != NULL");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (oldType._4_4_ != 0) {
    pDVar6 = DynamicType::GetTypeHandler(pDStack_18);
    iVar3 = (*pDVar6->_vptr_DynamicTypeHandler[0x4d])();
    if (iVar3 == 0) {
      pDVar6 = DynamicType::GetTypeHandler(pDStack_18);
      iVar3 = (*pDVar6->_vptr_DynamicTypeHandler[6])();
      if (iVar3 == 0) goto LAB_01404fa7;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                ,0x2de,
                                "(!keepProperties || (!newType->GetTypeHandler()->IsDeferredTypeHandler() && newType->GetTypeHandler()->GetPropertyCount() == 0))"
                                ,
                                "!keepProperties || (!newType->GetTypeHandler()->IsDeferredTypeHandler() && newType->GetTypeHandler()->GetPropertyCount() == 0)"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
LAB_01404fa7:
  oldTypeHandler = (DynamicTypeHandler *)GetDynamicType(this);
  local_30 = DynamicType::GetTypeHandler((DynamicType *)oldTypeHandler);
  uVar4 = (*local_30->_vptr_DynamicTypeHandler[0x5d])();
  if ((uVar4 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                ,0x2ef,"(!oldTypeHandler->HasAnyFixedProperties())",
                                "!oldTypeHandler->HasAnyFixedProperties()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  Memory::WriteBarrierPtr<Js::Type>::operator=
            (&(this->super_RecyclableObject).type,&pDStack_18->super_Type);
  bVar2 = IsAnyArray(this);
  if (!bVar2) {
    stackTraceValue = (Var)0x0;
    Memory::WriteBarrierPtr<Js::ArrayObject>::operator=
              (&(this->field_1).objectArray,&stackTraceValue);
  }
  (*local_30->_vptr_DynamicTypeHandler[0x4a])(local_30,this);
  pSVar7 = RecyclableObject::GetScriptContext(&this->super_RecyclableObject);
  pSVar8 = Js::Type::GetScriptContext(&pDStack_18->super_Type);
  if (pSVar7 != pSVar8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                ,0x2f8,"(this->GetScriptContext() == newType->GetScriptContext())",
                                "this->GetScriptContext() == newType->GetScriptContext()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pDVar6 = GetTypeHandler(this);
  iVar3 = (*pDVar6->_vptr_DynamicTypeHandler[0x4d])();
  if (iVar3 == 0) {
    if (oldType._4_4_ == 0) {
      pDVar6 = GetTypeHandler(this);
      (*pDVar6->_vptr_DynamicTypeHandler[0x4b])(pDVar6,this,0);
    }
    weakMapKeyMapValue = (Var)0x0;
    pSVar7 = RecyclableObject::GetScriptContext(&this->super_RecyclableObject);
    iVar3 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x14])(this,this,5,&weakMapKeyMapValue,0,pSVar7);
    if (iVar3 == 0) {
      weakMapKeyMapValue = (Var)0x0;
    }
    else {
      (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x19])(this,5,0,0);
    }
    mutationBpValue = (Var)0x0;
    pSVar7 = RecyclableObject::GetScriptContext(&this->super_RecyclableObject);
    iVar3 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x14])(this,this,7,&mutationBpValue,0,pSVar7);
    if (iVar3 == 0) {
      mutationBpValue = (Var)0x0;
    }
    else {
      (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x19])(this,7,0,8);
    }
    embedderData = (Var)0x0;
    pSVar7 = RecyclableObject::GetScriptContext(&this->super_RecyclableObject);
    iVar3 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x14])(this,this,0xe,&embedderData,0,pSVar7);
    if (iVar3 == 0) {
      embedderData = (Var)0x0;
    }
    else {
      (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x19])(this,0xe,0,8);
    }
    typeTransitionMap = (Var)0x0;
    pSVar7 = RecyclableObject::GetScriptContext(&this->super_RecyclableObject);
    iVar3 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x14])(this,this,0xf,&typeTransitionMap,0,pSVar7);
    if (iVar3 == 0) {
      typeTransitionMap = (Var)0x0;
    }
    else {
      (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x19])(this,0xf,0,8);
    }
    local_60 = 0;
    pSVar7 = RecyclableObject::GetScriptContext(&this->super_RecyclableObject);
    iVar3 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x14])(this,this,1,&local_60,0,pSVar7);
    if (iVar3 != 0) {
      (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x19])(this,1,0,8);
    }
    if (oldType._4_4_ != 0) {
      pDVar6 = GetTypeHandler(this);
      pSVar7 = RecyclableObject::GetScriptContext(&this->super_RecyclableObject);
      (*pDVar6->_vptr_DynamicTypeHandler[0x4c])(pDVar6,this,pSVar7,0);
      if (weakMapKeyMapValue != (Var)0x0) {
        (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject[0x19])(this,5,weakMapKeyMapValue,0,0);
      }
      if (mutationBpValue != (Var)0x0) {
        (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject[0x19])(this,7,mutationBpValue,8,0);
      }
      if (embedderData != (Var)0x0) {
        (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject[0x19])(this,0xe,embedderData,8,0);
      }
      if (typeTransitionMap != (Var)0x0) {
        (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject[0x19])(this,0xf,typeTransitionMap,8,0);
      }
    }
  }
  return;
}

Assistant:

void
    DynamicObject::ResetObject(DynamicType* newType, BOOL keepProperties)
    {
        Assert(newType != NULL);
        Assert(!keepProperties || (!newType->GetTypeHandler()->IsDeferredTypeHandler() && newType->GetTypeHandler()->GetPropertyCount() == 0));

        // This is what's going on here.  The newType comes from the (potentially) new script context, but the object is
        // described by the old type handler, so we want to keep that type handler.  We set the new type on the object, but
        // then re-set the type handler of that type back to the old type handler.  In the process, we may actually change
        // the type of the object again (if the new type was locked) via DuplicateType; the newer type will then also be
        // from the new script context.
        DynamicType * oldType = this->GetDynamicType();
        DynamicTypeHandler* oldTypeHandler = oldType->GetTypeHandler();

#if ENABLE_FIXED_FIELDS
        // Consider: Because we've disabled fixed properties on DOM objects, we don't need to rely on a type change here to
        // invalidate fixed properties.  Under some circumstances (with F12 tools enabled) an object which
        // is already in the new context can be reset and newType == oldType. If we re-enable fixed properties on DOM objects
        // we'll have to investigate and address this issue.
        // Assert(newType != oldType);
        // We only expect DOM objects to ever be reset and we explicitly disable fixed properties on DOM objects.
        Assert(!oldTypeHandler->HasAnyFixedProperties());
#endif

        this->type = newType;
        if (!IsAnyArray(this))
        {
            this->objectArray = nullptr;
        }
        oldTypeHandler->ResetTypeHandler(this);
        Assert(this->GetScriptContext() == newType->GetScriptContext());

        if (this->GetTypeHandler()->IsDeferredTypeHandler())
        {
            return;
        }

        if (!keepProperties)
        {
            this->GetTypeHandler()->SetAllPropertiesToUndefined(this, false);
        }

        // Marshalling cannot handle non-Var values, so extract
        // the two internal property values that could appear on a CEO, clear them to null which
        // marshalling does handle, and then restore them after marshalling.  Neither property's
        // data needs marshalling because:
        //  1. StackTrace's data does not contain references to JavaScript objects that would need marshalling.
        //  2. Values in the WeakMapKeyMap can only be accessed by the WeakMap object that put them there.  If
        //     that WeakMap is marshalled it will take care of any necessary marshalling of the value by virtue
        //     of being wrapped in CrossSite<>.

        Var stackTraceValue = nullptr;
        if (this->GetInternalProperty(this, InternalPropertyIds::StackTrace, &stackTraceValue, nullptr, this->GetScriptContext()))
        {
            this->SetInternalProperty(InternalPropertyIds::StackTrace, nullptr, PropertyOperation_None, nullptr);
        }
        else
        {
            // Above GetInternalProperty fails - which means the stackTraceValue is filed with Missing result. Reset to null so that we will not restore it back below.
            stackTraceValue = nullptr;
        }

        Var weakMapKeyMapValue = nullptr;
        if (this->GetInternalProperty(this, InternalPropertyIds::WeakMapKeyMap, &weakMapKeyMapValue, nullptr, this->GetScriptContext()))
        {
            this->SetInternalProperty(InternalPropertyIds::WeakMapKeyMap, nullptr, PropertyOperation_Force, nullptr);
        }
        else
        {
            weakMapKeyMapValue = nullptr;
        }

        Var mutationBpValue = nullptr;
        if (this->GetInternalProperty(this, InternalPropertyIds::MutationBp, &mutationBpValue, nullptr, this->GetScriptContext()))
        {
            this->SetInternalProperty(InternalPropertyIds::MutationBp, nullptr, PropertyOperation_Force, nullptr);
        }
        else
        {
            mutationBpValue = nullptr;
        }

        Var embedderData = nullptr;
        if (this->GetInternalProperty(this, InternalPropertyIds::EmbedderData,  &embedderData, nullptr, this->GetScriptContext()))
        {
          this->SetInternalProperty(InternalPropertyIds::EmbedderData, nullptr, PropertyOperation_Force, nullptr);
        }
        else
        {
          embedderData = nullptr;
        }

        // If value of TypeOfPrototypeObjectDictionary was set undefined above, reset it to nullptr so we don't type cast it wrongly to TypeTransitionMap* or we don't marshal the non-Var dictionary below
        Var typeTransitionMap = nullptr;
        if (this->GetInternalProperty(this, InternalPropertyIds::TypeOfPrototypeObjectDictionary, &typeTransitionMap, nullptr, this->GetScriptContext()))
        {
            this->SetInternalProperty(InternalPropertyIds::TypeOfPrototypeObjectDictionary, nullptr, PropertyOperation_Force, nullptr);
        }

        if (keepProperties)
        {
            this->GetTypeHandler()->MarshalAllPropertiesToScriptContext(this, this->GetScriptContext(), false);

            if (stackTraceValue)
            {
                this->SetInternalProperty(InternalPropertyIds::StackTrace, stackTraceValue, PropertyOperation_None, nullptr);
            }
            if (weakMapKeyMapValue)
            {
                this->SetInternalProperty(InternalPropertyIds::WeakMapKeyMap, weakMapKeyMapValue, PropertyOperation_Force, nullptr);
            }
            if (mutationBpValue)
            {
                this->SetInternalProperty(InternalPropertyIds::MutationBp, mutationBpValue, PropertyOperation_Force, nullptr);
            }
            if (embedderData)
            {
              this->SetInternalProperty(InternalPropertyIds::EmbedderData, embedderData, PropertyOperation_Force, nullptr);
            }
        }
    }